

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

bool __thiscall
cmsys::SystemInformationImplementation::RetrieveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  ostream *this_00;
  char *pcVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  uint *puVar6;
  ulonglong uVar7;
  long lVar8;
  double dVar9;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  float local_5dc;
  float local_5d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  string local_550;
  undefined1 local_530 [8];
  string cpuflags;
  undefined1 local_4f0 [8];
  string cacheSize;
  char **index;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char *local_4a8;
  char *local_4a0;
  undefined1 local_498 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  undefined1 local_3e0 [8];
  string cpurev;
  undefined1 local_3a0 [8];
  string cpuname;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  string familyStr;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  undefined1 local_1e0 [8];
  string CPUSpeed;
  undefined1 local_1b8 [4];
  uint NumberOfCoresPerSocket;
  string local_198;
  string local_178;
  undefined1 local_158 [8];
  string Cores;
  size_type local_130;
  uint64_t NumberOfSockets;
  string local_108;
  _Base_ptr local_e8;
  undefined1 local_e0;
  int local_d4;
  undefined1 local_d0 [4];
  int id;
  undefined1 local_b0 [8];
  string idc;
  set<int,_std::less<int>,_std::allocator<int>_> PhysicalIDs;
  size_t pos;
  size_t fileSize;
  FILE *fd;
  string buffer;
  SystemInformationImplementation *this_local;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  buffer.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&fd);
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    while (iVar2 = feof(__stream), iVar2 == 0) {
      iVar2 = fgetc(__stream);
      std::__cxx11::string::operator+=((string *)&fd,(char)iVar2);
    }
    fclose(__stream);
    std::__cxx11::string::resize((ulong)&fd);
    PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         std::__cxx11::string::find((char *)&fd,0xc9f087);
    while (PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0xffffffffffffffff) {
      this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
      PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count =
           std::__cxx11::string::find((char *)&fd,0xc9f087);
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&idc.field_2 + 8));
    std::__cxx11::string::string((string *)local_d0,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_b0,this,(string *)local_d0,"physical id",0);
    std::__cxx11::string::~string((string *)local_d0);
    while (this->CurrentPositionInFile != 0xffffffffffffffff) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_d4 = atoi(pcVar3);
      pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&idc.field_2 + 8)
                          ,&local_d4);
      local_e8 = (_Base_ptr)pVar10.first._M_node;
      local_e0 = pVar10.second;
      std::__cxx11::string::string((string *)&NumberOfSockets,(string *)&fd);
      ExtractValueFromCpuInfoFile
                (&local_108,this,(string *)&NumberOfSockets,"physical id",
                 this->CurrentPositionInFile + 1);
      std::__cxx11::string::operator=((string *)local_b0,(string *)&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&NumberOfSockets);
    }
    local_130 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           ((long)&idc.field_2 + 8));
    Cores.field_2._8_8_ = 1;
    puVar4 = std::max<unsigned_long>(&local_130,(unsigned_long *)(Cores.field_2._M_local_buf + 8));
    local_130 = *puVar4;
    std::__cxx11::string::string((string *)&local_178,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_158,this,&local_178,"cpu cores",0);
    std::__cxx11::string::~string((string *)&local_178);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::string((string *)local_1b8,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_198,this,(string *)local_1b8,"ncpus probed",0);
      std::__cxx11::string::operator=((string *)local_158,(string *)&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)local_1b8);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    CPUSpeed.field_2._12_4_ = atoi(pcVar3);
    CPUSpeed.field_2._8_4_ = 1;
    puVar6 = std::max<unsigned_int>
                       ((uint *)(CPUSpeed.field_2._M_local_buf + 0xc),
                        (uint *)(CPUSpeed.field_2._M_local_buf + 8));
    CPUSpeed.field_2._12_4_ = *puVar6;
    this->NumberOfPhysicalCPU = CPUSpeed.field_2._12_4_ * (int)local_130;
    if (this->NumberOfPhysicalCPU == 0) {
      this->NumberOfPhysicalCPU = 1;
    }
    if (this->NumberOfLogicalCPU == 0) {
      this->NumberOfLogicalCPU = this->NumberOfPhysicalCPU;
    }
    (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
         this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;
    std::__cxx11::string::string((string *)&local_200,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_1e0,this,&local_200,"cpu MHz",0);
    std::__cxx11::string::~string((string *)&local_200);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      dVar9 = atof(pcVar3);
      this->CPUSpeedInMHz = (float)dVar9;
    }
    else {
      std::__cxx11::string::string((string *)&local_240,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_220,this,&local_240,"Cpu0ClkTck",0);
      std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        uVar7 = strtoull(pcVar3,(char **)0x0,0x10);
        local_5d4 = (float)uVar7;
        this->CPUSpeedInMHz = local_5d4 / 1e+06;
      }
      else {
        std::__cxx11::string::string((string *)(familyStr.field_2._M_local_buf + 8),(string *)&fd);
        ExtractValueFromCpuInfoFile
                  (&local_260,this,(string *)((long)&familyStr.field_2 + 8),"CPU0ClkTck",0);
        std::__cxx11::string::operator=((string *)local_1e0,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
        std::__cxx11::string::~string((string *)(familyStr.field_2._M_local_buf + 8));
        pcVar3 = (char *)std::__cxx11::string::c_str();
        uVar7 = strtoull(pcVar3,(char **)0x0,10);
        local_5dc = (float)uVar7;
        this->CPUSpeedInMHz = local_5dc / 1e+06;
      }
    }
    std::__cxx11::string::string((string *)&local_2c0,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_2a0,this,&local_2c0,"cpu family",0);
    std::__cxx11::string::~string((string *)&local_2c0);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_300,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_2e0,this,&local_300,"CPU architecture",0);
      std::__cxx11::string::operator=((string *)local_2a0,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar3);
    (this->ChipID).Family = iVar2;
    std::__cxx11::string::string((string *)&local_340,(string *)&fd);
    ExtractValueFromCpuInfoFile(&local_320,this,&local_340,"vendor_id",0);
    std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    FindManufacturer(this,(string *)local_2a0);
    if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2a0,"PA-RISC 1.1a");
      if (bVar1) {
        (this->ChipID).Family = 0x11a;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2a0,"PA-RISC 2.0");
        if (bVar1) {
          (this->ChipID).Family = 0x200;
        }
      }
    }
    std::__cxx11::string::string((string *)(cpuname.field_2._M_local_buf + 8),(string *)&fd);
    ExtractValueFromCpuInfoFile(&local_360,this,(string *)((long)&cpuname.field_2 + 8),"model",0);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar3);
    (this->ChipID).Model = iVar2;
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)(cpuname.field_2._M_local_buf + 8));
    bVar1 = RetrieveClassicalCPUIdentity(this);
    if (!bVar1) {
      std::__cxx11::string::string((string *)(cpurev.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                ((string *)local_3a0,this,(string *)((long)&cpurev.field_2 + 8),"cpu",0);
      std::__cxx11::string::~string((string *)(cpurev.field_2._M_local_buf + 8));
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::operator=((string *)&(this->ChipID).ProcessorName,(string *)local_3a0)
        ;
      }
      std::__cxx11::string::~string((string *)local_3a0);
    }
    std::__cxx11::string::string((string *)&local_400,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_3e0,this,&local_400,"stepping",0);
    std::__cxx11::string::~string((string *)&local_400);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_440,(string *)&fd);
      ExtractValueFromCpuInfoFile(&local_420,this,&local_440,"CPU revision",0);
      std::__cxx11::string::operator=((string *)local_3e0,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
    }
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar3);
    (this->ChipID).Revision = iVar2;
    std::__cxx11::string::string
              ((string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&fd);
    ExtractValueFromCpuInfoFile
              (&local_460,this,
               (string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,"model name",0);
    std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,(string *)&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string
              ((string *)
               &cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::clear
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498);
    local_4a0 = "cache size";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498,&local_4a0);
    local_4a8 = "I-cache";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498,&local_4a8);
    __range1 = (vector<const_char_*,_std::allocator<const_char_*>_> *)anon_var_dwarf_1446dec;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498,
               (value_type *)&__range1);
    (this->Features).L1CacheSize = 0;
    __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498);
    index = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                               ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                       *)&index), bVar1) {
      cacheSize.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
           ::operator*(&__end1);
      std::__cxx11::string::string((string *)(cpuflags.field_2._M_local_buf + 8),(string *)&fd);
      ExtractValueFromCpuInfoFile
                ((string *)local_4f0,this,(string *)((long)&cpuflags.field_2 + 8),
                 *(char **)cacheSize.field_2._8_8_,0);
      std::__cxx11::string::~string((string *)(cpuflags.field_2._M_local_buf + 8));
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        lVar8 = std::__cxx11::string::find(local_4f0,0xc9f152);
        if (lVar8 != -1) {
          std::__cxx11::string::resize((ulong)local_4f0);
        }
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar2 = atoi(pcVar3);
        (this->Features).L1CacheSize = iVar2 + (this->Features).L1CacheSize;
      }
      std::__cxx11::string::~string((string *)local_4f0);
      __gnu_cxx::
      __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
      operator++(&__end1);
    }
    std::__cxx11::string::string((string *)&local_550,(string *)&fd);
    ExtractValueFromCpuInfoFile((string *)local_530,this,&local_550,"flags",0);
    std::__cxx11::string::~string((string *)&local_550);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::operator+(&local_590," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
      ;
      std::operator+(&local_570,&local_590," ");
      std::__cxx11::string::operator=((string *)local_530,(string *)&local_570);
      std::__cxx11::string::~string((string *)&local_570);
      std::__cxx11::string::~string((string *)&local_590);
      lVar8 = std::__cxx11::string::find(local_530,0xc9f156);
      if (lVar8 != -1) {
        (this->Features).HasFPU = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f15c);
      if (lVar8 != -1) {
        (this->Features).HasTSC = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f162);
      if (lVar8 != -1) {
        (this->Features).HasMMX = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f168);
      if (lVar8 != -1) {
        (this->Features).HasSSE = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f16e);
      if (lVar8 != -1) {
        (this->Features).HasSSE2 = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f175);
      if (lVar8 != -1) {
        (this->Features).HasAPIC = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f17c);
      if (lVar8 != -1) {
        (this->Features).HasCMOV = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f183);
      if (lVar8 != -1) {
        (this->Features).HasMTRR = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f18a);
      if (lVar8 != -1) {
        (this->Features).HasACPI = true;
      }
      lVar8 = std::__cxx11::string::find(local_530,0xc9f191);
      if (lVar8 != -1) {
        (this->Features).ExtendedFeatures.Has3DNow = true;
      }
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_530);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_498);
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::~string((string *)local_2a0);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_b0);
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)((long)&idc.field_2 + 8));
  }
  std::__cxx11::string::~string((string *)&fd);
  return this_local._7_1_;
}

Assistant:

bool SystemInformationImplementation::RetrieveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE* fd = fopen("/proc/cpuinfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
  }

  size_t fileSize = 0;
  while (!feof(fd)) {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
  }
  fclose(fd);
  buffer.resize(fileSize - 2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and SMT)
  size_t pos = buffer.find("processor\t");
  while (pos != std::string::npos) {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t", pos + 1);
  }

#if defined(__linux) || defined(__CYGWIN__)
  // Count sockets.
  std::set<int> PhysicalIDs;
  std::string idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id");
  while (this->CurrentPositionInFile != std::string::npos) {
    int id = atoi(idc.c_str());
    PhysicalIDs.insert(id);
    idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id",
                                            this->CurrentPositionInFile + 1);
  }
  uint64_t NumberOfSockets = PhysicalIDs.size();
  NumberOfSockets = std::max(NumberOfSockets, (uint64_t)1);
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string Cores = this->ExtractValueFromCpuInfoFile(buffer, "cpu cores");
  if (Cores.empty()) {
    // Linux Sparc is different
    Cores = this->ExtractValueFromCpuInfoFile(buffer, "ncpus probed");
  }
  auto NumberOfCoresPerSocket = (unsigned int)atoi(Cores.c_str());
  NumberOfCoresPerSocket = std::max(NumberOfCoresPerSocket, 1u);
  this->NumberOfPhysicalCPU =
    NumberOfCoresPerSocket * (unsigned int)NumberOfSockets;

#else
  // For systems which do not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu count");
  this->NumberOfPhysicalCPU = this->NumberOfLogicalCPU =
    atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if (this->NumberOfPhysicalCPU <= 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  if (this->NumberOfLogicalCPU == 0) {
    this->NumberOfLogicalCPU = this->NumberOfPhysicalCPU;
  }
  // LogicalProcessorsPerPhysical>1 => SMT.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical =
    this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "cpu MHz");
  if (!CPUSpeed.empty()) {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
  }
#ifdef __linux
  else {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "Cpu0ClkTck");
    if (!CPUSpeed.empty()) {
      this->CPUSpeedInMHz =
        static_cast<float>(strtoull(CPUSpeed.c_str(), nullptr, 16)) /
        1000000.0f;
    } else {
      // if the kernel is build as Sparc32 it's in decimal, note the different
      // case
      CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "CPU0ClkTck");
      this->CPUSpeedInMHz =
        static_cast<float>(strtoull(CPUSpeed.c_str(), nullptr, 10)) /
        1000000.0f;
    }
  }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu family");
  if (familyStr.empty()) {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer, "CPU architecture");
  }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer, "vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP) {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
  }

  // Chip Model
  this->ChipID.Model =
    atoi(this->ExtractValueFromCpuInfoFile(buffer, "model").c_str());
  if (!this->RetrieveClassicalCPUIdentity()) {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer, "cpu");
    if (!cpuname.empty()) {
      this->ChipID.ProcessorName = cpuname;
    }
  }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer, "stepping");
  if (cpurev.empty()) {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer, "CPU revision");
  }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName =
    this->ExtractValueFromCpuInfoFile(buffer, "model name");

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache");    // e.g. PA-RISC
  cachename.push_back("D-cache");    // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (auto& index : cachename) {
    std::string cacheSize = this->ExtractValueFromCpuInfoFile(buffer, index);
    if (!cacheSize.empty()) {
      pos = cacheSize.find(" KB");
      if (pos != std::string::npos) {
        cacheSize.resize(pos);
      }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
    }
  }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer, "flags");
  if (!cpurev.empty()) {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ") != std::string::npos)) {
      this->Features.HasFPU = true;
    }
    if ((cpuflags.find(" tsc ") != std::string::npos)) {
      this->Features.HasTSC = true;
    }
    if ((cpuflags.find(" mmx ") != std::string::npos)) {
      this->Features.HasMMX = true;
    }
    if ((cpuflags.find(" sse ") != std::string::npos)) {
      this->Features.HasSSE = true;
    }
    if ((cpuflags.find(" sse2 ") != std::string::npos)) {
      this->Features.HasSSE2 = true;
    }
    if ((cpuflags.find(" apic ") != std::string::npos)) {
      this->Features.HasAPIC = true;
    }
    if ((cpuflags.find(" cmov ") != std::string::npos)) {
      this->Features.HasCMOV = true;
    }
    if ((cpuflags.find(" mtrr ") != std::string::npos)) {
      this->Features.HasMTRR = true;
    }
    if ((cpuflags.find(" acpi ") != std::string::npos)) {
      this->Features.HasACPI = true;
    }
    if ((cpuflags.find(" 3dnow ") != std::string::npos)) {
      this->Features.ExtendedFeatures.Has3DNow = true;
    }
  }

  return true;
}